

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> * __thiscall
QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::operator=
          (QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *this,
          QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *other)

{
  Data *pDVar1;
  Data *pDVar2;
  Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *this_00;
  Data *o;
  
  pDVar1 = other->d;
  if (this->d != pDVar1) {
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar2 = this->d;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) &&
         (this_00 = this->d,
         this_00 != (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *)0x0
         )) {
        QHashPrivate::Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>::
        ~Data(this_00);
        operator_delete(this_00,0x28);
      }
    }
    this->d = pDVar1;
  }
  return this;
}

Assistant:

QHash &operator=(const QHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
        }
        return *this;
    }